

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringAnisotropyTests.cpp
# Opt level: O0

void __thiscall
vkt::texture::anon_unknown_0::FilteringAnisotropyTests::initPrograms
          (FilteringAnisotropyTests *this,SourceCollections *programCollection)

{
  value_type local_34;
  undefined1 local_30 [8];
  vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> programs;
  SourceCollections *programCollection_local;
  FilteringAnisotropyTests *this_local;
  
  programs.
  super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)programCollection;
  std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::vector
            ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
             local_30);
  local_34 = PROGRAM_2D_FLOAT;
  std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::push_back
            ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
             local_30,&local_34);
  util::initializePrograms
            ((SourceCollections *)
             programs.
             super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,PRECISION_HIGHP,
             (vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
             local_30);
  std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::~vector
            ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
             local_30);
  return;
}

Assistant:

void			initPrograms				(SourceCollections&	programCollection) const
	{
		std::vector<util::Program>	programs;
		programs.push_back(util::PROGRAM_2D_FLOAT);
		initializePrograms(programCollection,glu::PRECISION_HIGHP, programs);
	}